

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

wchar_t sftp_cmd_ls(sftp_command *cmd)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *output;
  char *pcVar4;
  char *ptr;
  sftp_request *psVar5;
  sftp_packet *psVar6;
  fxp_handle *handle;
  list_directory_from_sftp_ctx *ctx;
  fxp_names *names;
  size_t i;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  
  if (backend == (Backend *)0x0) {
    not_connected();
    return L'\0';
  }
  if (cmd->nwords < 2) {
    pcVar8 = ".";
  }
  else {
    pcVar8 = cmd->words[1];
  }
  sVar3 = strlen(pcVar8);
  pcVar4 = (char *)0x0;
  output = (char *)safemalloc(sVar3 + 1,1,0);
  _Var1 = wc_unescape(output,pcVar8);
  if (!_Var1) {
    safefree(output);
    pcVar4 = stripslashes(pcVar8,false);
    output = dupstr(pcVar8);
    iVar2 = (int)((long)pcVar4 - (long)pcVar8);
    output[iVar2] = '\0';
    if ((0 < iVar2) && (output[iVar2 - 1U] == '/')) {
      output[iVar2 - 1U] = '\0';
    }
    pcVar8 = (char *)safemalloc(((long)pcVar4 - (long)pcVar8 << 0x20) + 0x100000000 >> 0x20,1,0);
    _Var1 = wc_unescape(pcVar8,output);
    safefree(pcVar8);
    if (!_Var1) {
      puts("Multiple-level wildcards are not supported");
      goto LAB_001100fa;
    }
  }
  pcVar8 = canonify(output);
  ptr = stripctrl_string(string_scc,pcVar8);
  while (ptr != (char *)0x0) {
    printf("Listing directory %s\n",ptr);
    safefree(ptr);
    ptr = (char *)0x0;
  }
  psVar5 = fxp_opendir_send(pcVar8);
  psVar6 = sftp_wait_for_reply(psVar5);
  handle = fxp_opendir_recv(psVar6,psVar5);
  if (handle != (fxp_handle *)0x0) {
    ctx = list_directory_from_sftp_new();
    do {
      psVar5 = fxp_readdir_send(handle);
      psVar6 = sftp_wait_for_reply(psVar5);
      names = fxp_readdir_recv(psVar6,psVar5);
      if (names == (fxp_names *)0x0) {
        iVar2 = fxp_error_type();
        if (iVar2 != 1) {
          pcVar4 = fxp_error();
          printf("Reading directory %s: %s\n",output,pcVar4);
        }
LAB_00110130:
        psVar5 = fxp_close_send(handle);
        psVar6 = sftp_wait_for_reply(psVar5);
        fxp_close_recv(psVar6,psVar5);
        list_directory_from_sftp_finish(ctx);
        list_directory_from_sftp_free(ctx);
        safefree(pcVar8);
        safefree(output);
        return L'\x01';
      }
      iVar2 = names->nnames;
      if (iVar2 == 0) {
        fxp_free_names(names);
        goto LAB_00110130;
      }
      lVar9 = 0;
      for (uVar7 = 0; uVar7 < (ulong)(long)iVar2; uVar7 = uVar7 + 1) {
        if ((pcVar4 == (char *)0x0) ||
           (iVar2 = wc_match(pcVar4,*(char **)((long)&names->names->filename + lVar9)), iVar2 != 0))
        {
          list_directory_from_sftp_feed(ctx,(fxp_name *)((long)&names->names->filename + lVar9));
        }
        iVar2 = names->nnames;
        lVar9 = lVar9 + 0x48;
      }
      fxp_free_names(names);
    } while( true );
  }
  pcVar4 = fxp_error();
  printf("Unable to open %s: %s\n",output,pcVar4);
  safefree(pcVar8);
LAB_001100fa:
  safefree(output);
  return L'\0';
}

Assistant:

int sftp_cmd_ls(struct sftp_command *cmd)
{
    struct fxp_handle *dirh;
    struct fxp_names *names;
    const char *dir;
    char *cdir, *unwcdir, *wildcard;
    struct sftp_packet *pktin;
    struct sftp_request *req;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 2)
        dir = ".";
    else
        dir = cmd->words[1];

    unwcdir = snewn(1 + strlen(dir), char);
    if (wc_unescape(unwcdir, dir)) {
        dir = unwcdir;
        wildcard = NULL;
    } else {
        char *tmpdir;
        int len;
        bool check;

        sfree(unwcdir);
        wildcard = stripslashes(dir, false);
        unwcdir = dupstr(dir);
        len = wildcard - dir;
        unwcdir[len] = '\0';
        if (len > 0 && unwcdir[len-1] == '/')
            unwcdir[len-1] = '\0';
        tmpdir = snewn(1 + len, char);
        check = wc_unescape(tmpdir, unwcdir);
        sfree(tmpdir);
        if (!check) {
            printf("Multiple-level wildcards are not supported\n");
            sfree(unwcdir);
            return 0;
        }
        dir = unwcdir;
    }

    cdir = canonify(dir);

    with_stripctrl(san, cdir)
        printf("Listing directory %s\n", san);

    req = fxp_opendir_send(cdir);
    pktin = sftp_wait_for_reply(req);
    dirh = fxp_opendir_recv(pktin, req);

    if (dirh == NULL) {
        printf("Unable to open %s: %s\n", dir, fxp_error());
        sfree(cdir);
        sfree(unwcdir);
        return 0;
    } else {
        struct list_directory_from_sftp_ctx *ctx =
            list_directory_from_sftp_new();

        while (1) {

            req = fxp_readdir_send(dirh);
            pktin = sftp_wait_for_reply(req);
            names = fxp_readdir_recv(pktin, req);

            if (names == NULL) {
                if (fxp_error_type() == SSH_FX_EOF)
                    break;
                printf("Reading directory %s: %s\n", dir, fxp_error());
                break;
            }
            if (names->nnames == 0) {
                fxp_free_names(names);
                break;
            }

            for (size_t i = 0; i < names->nnames; i++)
                if (!wildcard || wc_match(wildcard, names->names[i].filename))
                    list_directory_from_sftp_feed(ctx, &names->names[i]);

            fxp_free_names(names);
        }

        req = fxp_close_send(dirh);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);

        list_directory_from_sftp_finish(ctx);
        list_directory_from_sftp_free(ctx);
    }

    sfree(cdir);
    sfree(unwcdir);

    return 1;
}